

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int fsg_model_word_id(fsg_model_t *fsg,char *word)

{
  int iVar1;
  int local_24;
  int wid;
  char *word_local;
  fsg_model_t *fsg_local;
  
  local_24 = 0;
  while ((local_24 < fsg->n_word && (iVar1 = strcmp(fsg->vocab[local_24],word), iVar1 != 0))) {
    local_24 = local_24 + 1;
  }
  if (local_24 == fsg->n_word) {
    fsg_local._4_4_ = -1;
  }
  else {
    fsg_local._4_4_ = local_24;
  }
  return fsg_local._4_4_;
}

Assistant:

int
fsg_model_word_id(fsg_model_t * fsg, char const *word)
{
    int wid;

    /* Search for an existing word matching this. */
    for (wid = 0; wid < fsg->n_word; ++wid) {
        if (0 == strcmp(fsg->vocab[wid], word))
            break;
    }
    /* If not found, add this to the vocab. */
    if (wid == fsg->n_word)
        return -1;
    return wid;
}